

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

void __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator::to_next_data
          (hashtable_iterator *this)

{
  bool bVar1;
  pointer pvVar2;
  iterator iVar3;
  bool local_31;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_18;
  hashtable_iterator *local_10;
  hashtable_iterator *this_local;
  
  local_10 = this;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&this->mCurBucketItr,&this->mEndBucketItr);
    local_31 = false;
    if (bVar1) {
      pvVar2 = __gnu_cxx::
               __normal_iterator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_*,_std::vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ::operator->(&this->mCurBucketItr);
      local_18._M_current =
           (pair<int,_int> *)
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(pvVar2);
      local_31 = __gnu_cxx::operator==(&this->mCurValueItr,&local_18);
    }
    if (local_31 == false) break;
    __gnu_cxx::
    __normal_iterator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_*,_std::vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::operator++(&this->mCurBucketItr,0);
    bVar1 = __gnu_cxx::operator==(&this->mCurBucketItr,&this->mEndBucketItr);
    if (bVar1) {
      return;
    }
    pvVar2 = __gnu_cxx::
             __normal_iterator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_*,_std::vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ::operator->(&this->mCurBucketItr);
    iVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(pvVar2);
    (this->mCurValueItr)._M_current = iVar3._M_current;
  }
  return;
}

Assistant:

void to_next_data() {
          while (mCurBucketItr != mEndBucketItr &&
                 mCurValueItr == mCurBucketItr->end()) {
            mCurBucketItr++;
            if (mCurBucketItr == mEndBucketItr) break;
            mCurValueItr = mCurBucketItr->begin();
          }
        }